

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O3

void test_skiplist_get_node_single_low(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_status_t iVar2;
  ion_sl_node_t *piVar3;
  int search;
  int key;
  ion_byte_t str [10];
  ion_skiplist_t skiplist;
  undefined4 local_60;
  undefined4 local_5c;
  undefined8 local_58;
  undefined2 local_50;
  ion_skiplist_t local_48;
  
  sl_initialize(&local_48,key_type_numeric_signed,4,10,7,1,4);
  local_48.super.compare = dictionary_compare_signed_value;
  local_58 = 0x69687420646e6966;
  local_50 = 0x73;
  local_5c = 3;
  iVar2 = sl_insert(&local_48,&local_5c,&local_58);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(iVar2.error == '\0'),0x1ad,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 != '\0') {
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(iVar2.count == 1),0x1ae,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 != '\0') {
      local_60 = 2;
      piVar3 = sl_find_node(&local_48,&local_60);
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(piVar3 == local_48.head),0x1b7,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                         ,"condition was false, expected true");
      if (pVar1 != '\0') {
        sl_destroy(&local_48);
        return;
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_skiplist_get_node_single_low(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	ion_byte_t str[10];

	strcpy((char *) str, "find this");

	int key				= 3;

	ion_status_t status = sl_insert(&skiplist, (ion_key_t) &key, str);

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	int				search	= 2;
	ion_sl_node_t	*node	= sl_find_node(&skiplist, (ion_key_t) &search);

	PLANCK_UNIT_ASSERT_TRUE(tc, node == skiplist.head);

	sl_destroy(&skiplist);
}